

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O0

ostream * plot::detail::operator<<(ostream *stream,foreground_setter *setter)

{
  Color *pCVar1;
  TerminalMode TVar2;
  Color32 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  foreground_setter_256 local_39;
  undefined8 local_38;
  undefined8 uStack_30;
  ansi_color local_28;
  foreground_setter *local_20;
  foreground_setter *setter_local;
  ostream *stream_local;
  
  TVar2 = setter->mode;
  local_20 = setter;
  setter_local = (foreground_setter *)stream;
  if (TVar2 == Ansi) {
    pCVar1 = &setter->color;
    local_38._0_4_ = pCVar1->r;
    local_38._4_4_ = pCVar1->g;
    uStack_30._0_4_ = (setter->color).b;
    uStack_30._4_4_ = (setter->color).a;
    local_28 = (ansi_color)ansi::foreground((ansi *)stream,*pCVar1);
    stream_local = ansi::detail::operator<<(stream,(foreground_setter *)&local_28);
  }
  else if (TVar2 == Ansi256) {
    pCVar1 = &setter->color;
    local_58._0_4_ = pCVar1->r;
    local_58._4_4_ = pCVar1->g;
    uStack_50._0_4_ = (setter->color).b;
    uStack_50._4_4_ = (setter->color).a;
    local_39 = ansi::foreground256((ansi *)stream,*pCVar1);
    stream_local = ansi::detail::operator<<(stream,&local_39);
  }
  else {
    stream_local = stream;
    if (TVar2 == Iso24bit) {
      local_5c = (Color32)ansi::foreground24bit((ansi *)stream,setter->color);
      stream_local = ansi::detail::operator<<(stream,(foreground_setter_24bit *)&local_5c);
    }
  }
  return stream_local;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, foreground_setter const& setter) {
        switch (setter.mode) {
            case TerminalMode::Ansi:
                return stream << ansi::foreground(setter.color);
            case TerminalMode::Ansi256:
                return stream << ansi::foreground256(setter.color);
            case TerminalMode::Iso24bit:
                return stream << ansi::foreground24bit(setter.color);
            default:
                return stream;
        }
    }